

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O2

void errmsg(char *m)

{
  size_t __n;
  ssize_t sVar1;
  
  __n = strlen(m);
  while( true ) {
    if (__n == 0) {
      return;
    }
    sVar1 = write(2,m,__n);
    if (sVar1 < 1) break;
    m = m + sVar1;
    __n = __n - sVar1;
  }
  return;
}

Assistant:

static void
errmsg(const char *m)
{
	size_t s = strlen(m);
	ssize_t written;

	while (s > 0) {
		written = write(2, m, s);
		if (written <= 0)
			return;
		m += written;
		s -= written;
	}
}